

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_node __thiscall
pugi::xml_node::first_element_by_path(xml_node *this,char_t *path_,char_t delimiter)

{
  char *pcVar1;
  char cVar2;
  xml_node_struct *pxVar3;
  xml_node xVar4;
  char_t *pcVar5;
  xml_node *this_00;
  long lVar6;
  long lVar7;
  char_t *pcVar8;
  char_t *path__00;
  xml_node local_40;
  xml_node local_38;
  
  if (*path_ == delimiter) {
    pxVar3 = this->_root;
    if (pxVar3 == (xml_node_struct *)0x0) {
      return (xml_node)(xml_node_struct *)0x0;
    }
    local_38._root = (xml_node_struct *)(*(long *)((long)pxVar3 - (pxVar3->header >> 8)) + -0x40);
  }
  else {
    local_38 = (xml_node)this->_root;
    if (local_38._root == (xml_node_struct *)0x0) {
      return (xml_node)(xml_node_struct *)0x0;
    }
  }
  pcVar8 = path_ + -3;
  do {
    pcVar5 = pcVar8;
    cVar2 = pcVar5[3];
    pcVar8 = pcVar5 + 1;
  } while (cVar2 == delimiter);
  lVar7 = 0;
  do {
    lVar6 = lVar7;
    lVar7 = lVar6 + 1;
    if (pcVar5[lVar6 + 3] == '\0') break;
  } while (pcVar5[lVar6 + 3] != delimiter);
  if (lVar7 == 1) {
    return (xml_node)local_38._root;
  }
  pcVar8 = pcVar5 + 1 + lVar7;
  do {
    path__00 = pcVar8 + 1;
    pcVar1 = pcVar8 + 1;
    pcVar8 = path__00;
  } while (*pcVar1 == delimiter);
  if (lVar7 == 2 && cVar2 == '.') {
    this_00 = &local_38;
  }
  else {
    if (((cVar2 != '.') || (lVar7 != 3)) || (pcVar5[4] != '.')) {
      pxVar3 = (local_38._root)->first_child;
      do {
        if (pxVar3 == (xml_node_struct *)0x0) {
          return (xml_node)(xml_node_struct *)0x0;
        }
        pcVar8 = pxVar3->name;
        if (pcVar8 != (char_t *)0x0) {
          lVar7 = 0;
          do {
            if (pcVar8[lVar7] != pcVar5[lVar7 + 3]) goto LAB_00126ba7;
            lVar7 = lVar7 + 1;
          } while (lVar6 != lVar7);
          if ((pcVar8[lVar6] == '\0') &&
             (local_40._root = pxVar3, xVar4 = first_element_by_path(&local_40,path__00,delimiter),
             xVar4._root != (xml_node_struct *)0x0)) {
            return (xml_node)xVar4._root;
          }
        }
LAB_00126ba7:
        pxVar3 = pxVar3->next_sibling;
      } while( true );
    }
    local_40._root = (local_38._root)->parent;
    this_00 = &local_40;
  }
  xVar4 = first_element_by_path(this_00,path__00,delimiter);
  return (xml_node)xVar4._root;
}

Assistant:

PUGI__FN xml_node xml_node::first_element_by_path(const char_t* path_, char_t delimiter) const
	{
		xml_node context = path_[0] == delimiter ? root() : *this;

		if (!context._root) return xml_node();

		const char_t* path_segment = path_;

		while (*path_segment == delimiter) ++path_segment;

		const char_t* path_segment_end = path_segment;

		while (*path_segment_end && *path_segment_end != delimiter) ++path_segment_end;

		if (path_segment == path_segment_end) return context;

		const char_t* next_segment = path_segment_end;

		while (*next_segment == delimiter) ++next_segment;

		if (*path_segment == '.' && path_segment + 1 == path_segment_end)
			return context.first_element_by_path(next_segment, delimiter);
		else if (*path_segment == '.' && *(path_segment+1) == '.' && path_segment + 2 == path_segment_end)
			return context.parent().first_element_by_path(next_segment, delimiter);
		else
		{
			for (xml_node_struct* j = context._root->first_child; j; j = j->next_sibling)
			{
				if (j->name && impl::strequalrange(j->name, path_segment, static_cast<size_t>(path_segment_end - path_segment)))
				{
					xml_node subsearch = xml_node(j).first_element_by_path(next_segment, delimiter);

					if (subsearch) return subsearch;
				}
			}

			return xml_node();
		}
	}